

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
             *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
  pVar1;
  ulong uVar2;
  char cVar3;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
  pVar4;
  char *pcVar5;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
  *ppVar6;
  char cVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
  pVar12;
  
  lVar9 = *(long *)(this + 0x10);
  if (lVar9 != 0) {
    pcVar5 = (it->super_truncating_iterator_base<char_*>).out_;
    uVar8 = (it->super_truncating_iterator_base<char_*>).limit_;
    sVar10 = (it->super_truncating_iterator_base<char_*>).count_;
    cVar7 = it->blackhole_;
    if (0 < lVar9) {
      pcVar11 = *(char **)(this + 8);
      lVar9 = lVar9 + 1;
      do {
        cVar3 = *pcVar11;
        if (sVar10 < uVar8) {
          *pcVar5 = *pcVar11;
          cVar3 = cVar7;
        }
        cVar7 = cVar3;
        pcVar11 = pcVar11 + 1;
        pcVar5 = pcVar5 + (sVar10 < uVar8);
        sVar10 = sVar10 + 1;
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
    (it->super_truncating_iterator_base<char_*>).out_ = pcVar5;
    (it->super_truncating_iterator_base<char_*>).limit_ = uVar8;
    (it->super_truncating_iterator_base<char_*>).count_ = sVar10;
    it->blackhole_ = cVar7;
  }
  ppVar6 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
            *)(it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  uVar8 = (it->super_truncating_iterator_base<char_*>).count_;
  pVar12 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer>
            )it->blackhole_;
  lVar9 = *(long *)(this + 0x20);
  if (lVar9 != 0) {
    pVar1 = this[0x18];
    do {
      pVar4 = pVar1;
      if (uVar8 < uVar2) {
        *ppVar6 = pVar1;
        pVar4 = pVar12;
      }
      pVar12 = pVar4;
      ppVar6 = ppVar6 + (uVar8 < uVar2);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  (it->super_truncating_iterator_base<char_*>).out_ = (char *)ppVar6;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = uVar8;
  it->blackhole_ = (value_type)pVar12;
  int_writer<int,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
            ((dec_writer *)(this + 0x28),it);
  return;
}

Assistant:

inline T *make_checked(T *p, std::size_t) { return p; }